

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void leveldb::anon_unknown_1::PosixEnv::BackgroundThreadEntryPoint(PosixEnv *env)

{
  Mutex *__mutex;
  _func_void_void_ptr *p_Var1;
  void *pvVar2;
  _Map_pointer ppBVar3;
  int iVar4;
  _Elt_pointer pBVar5;
  long in_FS_OFFSET;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &env->background_work_mutex_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    do {
      while (pBVar5 = (env->background_work_queue_).c.
                      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur,
            (env->background_work_queue_).c.
            super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur == pBVar5) {
        local_48._M_device = &((env->background_work_cv_).mu_)->mu_;
        local_48._M_owns = true;
        std::condition_variable::wait((unique_lock *)&env->background_work_cv_);
        local_48._M_device = (mutex_type *)0x0;
        local_48._M_owns = false;
        std::unique_lock<std::mutex>::~unique_lock(&local_48);
      }
      p_Var1 = pBVar5->function;
      pvVar2 = pBVar5->arg;
      if (pBVar5 == (env->background_work_queue_).c.
                    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete((env->background_work_queue_).c.
                        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        ppBVar3 = (env->background_work_queue_).c.
                  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        (env->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = ppBVar3 + 1;
        pBVar5 = ppBVar3[1];
        (env->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pBVar5;
        (env->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pBVar5 + 0x20;
      }
      else {
        pBVar5 = pBVar5 + 1;
      }
      (env->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = pBVar5;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      (*p_Var1)(pvVar2);
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    } while (iVar4 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_system_error(iVar4);
  }
  __stack_chk_fail();
}

Assistant:

static void BackgroundThreadEntryPoint(PosixEnv* env) {
    env->BackgroundThreadMain();
  }